

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_ParseParameters::test_method(util_ParseParameters *this)

{
  long lVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  size_type sVar12;
  ArgsManager *this_00;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar13;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffffef18;
  undefined7 in_stack_ffffffffffffef20;
  undefined1 in_stack_ffffffffffffef27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef30;
  undefined4 in_stack_ffffffffffffef38;
  int in_stack_ffffffffffffef3c;
  ArgsManager *in_stack_ffffffffffffef40;
  pair<const_char_*,_ArgsManager::Flags> *in_stack_ffffffffffffef48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffffef50;
  undefined7 in_stack_ffffffffffffef58;
  undefined1 in_stack_ffffffffffffef5f;
  iterator in_stack_ffffffffffffef60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined7 in_stack_ffffffffffffef88;
  string *in_stack_ffffffffffffefd0;
  char **in_stack_ffffffffffffefd8;
  undefined8 in_stack_ffffffffffffefe0;
  ArgsManager *in_stack_ffffffffffffefe8;
  string *local_d98;
  util_ParseParameters *this_local;
  const_string local_d00 [2];
  lazy_ostream local_ce0 [2];
  undefined1 local_cb9 [81];
  const_string local_c68 [2];
  lazy_ostream local_c48 [2];
  allocator<char> local_c21;
  assertion_result local_c20 [2];
  const_string local_be8 [2];
  lazy_ostream local_bc8 [2];
  allocator<char> local_ba1;
  assertion_result local_ba0 [2];
  const_string local_b68 [2];
  lazy_ostream local_b48 [2];
  allocator<char> local_b21;
  assertion_result local_b20 [2];
  const_string local_ae8 [2];
  lazy_ostream local_ac8 [2];
  allocator<char> local_aa1;
  assertion_result local_aa0 [2];
  const_string local_a68 [2];
  lazy_ostream local_a48 [2];
  allocator<char> local_a21;
  assertion_result local_a20 [2];
  const_string local_9e8 [2];
  lazy_ostream local_9c8 [2];
  allocator<char> local_9a5;
  allocator<char> local_9a4;
  allocator<char> local_9a3;
  allocator<char> local_9a2;
  allocator<char> local_9a1;
  assertion_result local_9a0 [2];
  const_string local_968 [2];
  lazy_ostream local_948 [2];
  allocator<char> local_925;
  allocator<char> local_924;
  allocator<char> local_923;
  allocator<char> local_922;
  allocator<char> local_921;
  assertion_result local_920 [2];
  const_string local_8e8 [2];
  lazy_ostream local_8c8 [2];
  assertion_result local_8a8 [2];
  const_string local_870 [2];
  lazy_ostream local_850 [2];
  assertion_result local_830 [2];
  const_string local_7f8 [2];
  lazy_ostream local_7d8 [2];
  assertion_result local_7b8 [2];
  const_string local_780 [2];
  lazy_ostream local_760 [2];
  assertion_result local_740 [2];
  const_string local_708 [2];
  lazy_ostream local_6e8 [2];
  assertion_result local_6c8 [2];
  const_string local_690 [2];
  lazy_ostream local_670 [2];
  assertion_result local_650 [3];
  char *local_5f8;
  Flags local_5f0;
  undefined4 local_5e4;
  char *local_5e0;
  Flags local_5d8;
  undefined4 local_5cc;
  char *local_5c8;
  Flags local_5c0;
  undefined4 local_5b4;
  char *local_5b0;
  Flags local_5a8;
  undefined4 local_59c;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  pair<const_char_*,_ArgsManager::Flags> d;
  pair<const_char_*,_ArgsManager::Flags> ccc;
  pair<const_char_*,_ArgsManager::Flags> b;
  pair<const_char_*,_ArgsManager::Flags> a;
  string local_348 [5];
  string error;
  char *argv_test [7];
  TestArgsManager testArgs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_ffffffffffffef18);
  local_59c = 1;
  pVar13 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                     ((char (*) [3])in_stack_ffffffffffffef30,(Flags *)in_stack_ffffffffffffef28);
  local_5b0 = pVar13.first;
  local_5a8 = pVar13.second;
  local_5b4 = 1;
  pVar13 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                     ((char (*) [3])in_stack_ffffffffffffef30,(Flags *)in_stack_ffffffffffffef28);
  local_5c8 = pVar13.first;
  local_5c0 = pVar13.second;
  local_5cc = 1;
  pVar13 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                     ((char (*) [5])in_stack_ffffffffffffef30,(Flags *)in_stack_ffffffffffffef28);
  local_5e0 = pVar13.first;
  local_5d8 = pVar13.second;
  local_5e4 = 1;
  pVar13 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                     ((char (*) [3])in_stack_ffffffffffffef30,(Flags *)in_stack_ffffffffffffef28);
  local_5f8 = pVar13.first;
  local_5f0 = pVar13.second;
  std::__cxx11::string::string(in_stack_ffffffffffffef30);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef50,
             (char *)in_stack_ffffffffffffef48,(char *)in_stack_ffffffffffffef40,
             in_stack_ffffffffffffef3c,SUB41((uint)in_stack_ffffffffffffef38 >> 0x18,0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_ffffffffffffef18);
  __l._M_len = (size_type)in_stack_ffffffffffffef68;
  __l._M_array = in_stack_ffffffffffffef60;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),__l,
           (allocator_type *)in_stack_ffffffffffffef50);
  TestArgsManager::SetupArgs
            ((TestArgsManager *)in_stack_ffffffffffffef60,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffef28);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_ffffffffffffef18);
  local_d98 = &error;
  do {
    local_d98 = (string *)((long)&local_d98[-2].field_2 + 8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(in_stack_ffffffffffffef18);
  } while (local_d98 != local_348);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    ArgsManager::ParseParameters
              (in_stack_ffffffffffffefe8,(int)((ulong)in_stack_ffffffffffffefe0 >> 0x20),
               in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_650,local_670,local_690,0xde,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    bVar9 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                     *)in_stack_ffffffffffffef18);
    if (bVar9) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
      ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
               *)in_stack_ffffffffffffef18);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6c8,local_6e8,local_708,0xdf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    ArgsManager::ParseParameters
              (in_stack_ffffffffffffefe8,(int)((ulong)in_stack_ffffffffffffefe0 >> 0x20),
               in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_740,local_760,local_780,0xe1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    bVar9 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                     *)in_stack_ffffffffffffef18);
    if (bVar9) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
      ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
               *)in_stack_ffffffffffffef18);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7b8,local_7d8,local_7f8,0xe2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    ArgsManager::ParseParameters
              (in_stack_ffffffffffffefe8,(int)((ulong)in_stack_ffffffffffffefe0 >> 0x20),
               in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_830,local_850,local_870,0xe4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
             ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                     *)in_stack_ffffffffffffef18);
    if (sVar12 == 3) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
      ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
               *)in_stack_ffffffffffffef18);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8a8,local_8c8,local_8e8,0xe8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    std::allocator<char>::allocator();
    bVar8 = false;
    bVar7 = false;
    bVar6 = false;
    bVar5 = false;
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
    bVar9 = false;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
    bVar10 = ArgsManager::IsArgSet
                       (in_stack_ffffffffffffef40,
                        (string *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    if (bVar10) {
      std::allocator<char>::allocator();
      bVar8 = true;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
      bVar7 = true;
      bVar10 = ArgsManager::IsArgSet
                         (in_stack_ffffffffffffef40,
                          (string *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      if (bVar10) {
        std::allocator<char>::allocator();
        bVar6 = true;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58))
        ;
        bVar5 = true;
        bVar10 = ArgsManager::IsArgSet
                           (in_stack_ffffffffffffef40,
                            (string *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38))
        ;
        if (bVar10) {
          std::allocator<char>::allocator();
          bVar4 = true;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
          bVar3 = true;
          bVar10 = ArgsManager::IsArgSet
                             (in_stack_ffffffffffffef40,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
          if (!bVar10) {
            std::allocator<char>::allocator();
            bVar2 = true;
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
            bVar9 = true;
            ArgsManager::IsArgSet
                      (in_stack_ffffffffffffef40,
                       (string *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
          }
        }
      }
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_920,local_948,local_968,0xea,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    if (bVar9) {
      std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    }
    if (bVar2) {
      std::allocator<char>::~allocator(&local_925);
    }
    if (bVar3) {
      std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    }
    if (bVar4) {
      std::allocator<char>::~allocator(&local_924);
    }
    if (bVar5) {
      std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    }
    if (bVar6) {
      std::allocator<char>::~allocator(&local_923);
    }
    if (bVar7) {
      std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    }
    if (bVar8) {
      std::allocator<char>::~allocator(&local_922);
    }
    std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    std::allocator<char>::~allocator(&local_921);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    std::allocator<char>::allocator();
    bVar8 = false;
    bVar7 = false;
    bVar6 = false;
    bVar5 = false;
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
    bVar9 = false;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                      *)in_stack_ffffffffffffef28,
                     (key_type *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
    if (sVar12 != 0) {
      std::allocator<char>::allocator();
      bVar8 = true;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
      bVar7 = true;
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                        *)in_stack_ffffffffffffef28,
                       (key_type *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
      if (sVar12 != 0) {
        std::allocator<char>::allocator();
        bVar6 = true;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58))
        ;
        bVar5 = true;
        sVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffffef28,
                         (key_type *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
        if (sVar12 != 0) {
          std::allocator<char>::allocator();
          bVar4 = true;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
          bVar3 = true;
          sVar12 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                   ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                            *)in_stack_ffffffffffffef28,
                           (key_type *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20)
                          );
          if (sVar12 == 0) {
            std::allocator<char>::allocator();
            bVar2 = true;
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
            bVar9 = true;
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                     *)in_stack_ffffffffffffef28,
                    (key_type *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
          }
        }
      }
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9a0,local_9c8,local_9e8,0xec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    if (bVar9) {
      std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    }
    if (bVar2) {
      std::allocator<char>::~allocator(&local_9a5);
    }
    if (bVar3) {
      std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    }
    if (bVar4) {
      std::allocator<char>::~allocator(&local_9a4);
    }
    if (bVar5) {
      std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    }
    if (bVar6) {
      std::allocator<char>::~allocator(&local_9a3);
    }
    if (bVar7) {
      std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    }
    if (bVar8) {
      std::allocator<char>::~allocator(&local_9a2);
    }
    std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    std::allocator<char>::~allocator(&local_9a1);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                  *)in_stack_ffffffffffffef40,
                 (key_type *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    std::vector<UniValue,_std::allocator<UniValue>_>::size
              ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a20,local_a48,local_a68,0xee,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    std::allocator<char>::~allocator(&local_a21);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                  *)in_stack_ffffffffffffef40,
                 (key_type *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    std::vector<UniValue,_std::allocator<UniValue>_>::front
              ((vector<UniValue,_std::allocator<UniValue>_> *)
               CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
    UniValue::get_str_abi_cxx11_
              ((UniValue *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
    std::operator==(in_stack_ffffffffffffef28,
                    (char *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_aa0,local_ac8,local_ae8,0xef,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    std::allocator<char>::~allocator(&local_aa1);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                  *)in_stack_ffffffffffffef40,
                 (key_type *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    std::vector<UniValue,_std::allocator<UniValue>_>::size
              ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b20,local_b48,local_b68,0xf0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    std::allocator<char>::~allocator(&local_b21);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                  *)in_stack_ffffffffffffef40,
                 (key_type *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    std::vector<UniValue,_std::allocator<UniValue>_>::front
              ((vector<UniValue,_std::allocator<UniValue>_> *)
               CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
    UniValue::get_str_abi_cxx11_
              ((UniValue *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
    std::operator==(in_stack_ffffffffffffef28,
                    (char *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ba0,local_bc8,local_be8,0xf1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    std::allocator<char>::~allocator(&local_ba1);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef68,(char *)in_stack_ffffffffffffef60,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                  *)in_stack_ffffffffffffef40,
                 (key_type *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    std::vector<UniValue,_std::allocator<UniValue>_>::back
              ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffef18);
    this_00 = (ArgsManager *)
              UniValue::get_str_abi_cxx11_
                        ((UniValue *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
    uVar11 = std::operator==(in_stack_ffffffffffffef28,
                             (char *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c20,local_c48,local_c68,0xf2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    std::allocator<char>::~allocator(&local_c21);
    bVar9 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               (const_string *)in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48,
               (const_string *)in_stack_ffffffffffffef40);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cb9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_stack_ffffffffffffef60,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58));
    ArgsManager::GetArgs(this_00,(string *)CONCAT17(uVar11,in_stack_ffffffffffffef88));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef28,(bool)in_stack_ffffffffffffef27);
    in_stack_ffffffffffffef60 = (iterator)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef28,
               (pointer)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
               (unsigned_long)in_stack_ffffffffffffef18);
    in_stack_ffffffffffffef18 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_cb9 + 0x19),local_ce0,local_d00,0xf3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffef28);
    std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
    std::allocator<char>::~allocator((allocator<char> *)local_cb9);
    in_stack_ffffffffffffef5f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffef5f);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef18);
  std::__cxx11::string::~string(&in_stack_ffffffffffffef18->first);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_ffffffffffffef18);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseParameters)
{
    TestArgsManager testArgs;
    const auto a = std::make_pair("-a", ArgsManager::ALLOW_ANY);
    const auto b = std::make_pair("-b", ArgsManager::ALLOW_ANY);
    const auto ccc = std::make_pair("-ccc", ArgsManager::ALLOW_ANY);
    const auto d = std::make_pair("-d", ArgsManager::ALLOW_ANY);

    const char *argv_test[] = {"-ignored", "-a", "-b", "-ccc=argument", "-ccc=multiple", "f", "-d=e"};

    std::string error;
    LOCK(testArgs.cs_args);
    testArgs.SetupArgs({a, b, ccc, d});
    BOOST_CHECK(testArgs.ParseParameters(0, argv_test, error));
    BOOST_CHECK(testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty());

    BOOST_CHECK(testArgs.ParseParameters(1, argv_test, error));
    BOOST_CHECK(testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty());

    BOOST_CHECK(testArgs.ParseParameters(7, argv_test, error));
    // expectation: -ignored is ignored (program name argument),
    // -a, -b and -ccc end up in map, -d ignored because it is after
    // a non-option argument (non-GNU option parsing)
    BOOST_CHECK(testArgs.m_settings.command_line_options.size() == 3 && testArgs.m_settings.ro_config.empty());
    BOOST_CHECK(testArgs.IsArgSet("-a") && testArgs.IsArgSet("-b") && testArgs.IsArgSet("-ccc")
                && !testArgs.IsArgSet("f") && !testArgs.IsArgSet("-d"));
    BOOST_CHECK(testArgs.m_settings.command_line_options.count("a") && testArgs.m_settings.command_line_options.count("b") && testArgs.m_settings.command_line_options.count("ccc")
                && !testArgs.m_settings.command_line_options.count("f") && !testArgs.m_settings.command_line_options.count("d"));

    BOOST_CHECK(testArgs.m_settings.command_line_options["a"].size() == 1);
    BOOST_CHECK(testArgs.m_settings.command_line_options["a"].front().get_str() == "");
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].size() == 2);
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].front().get_str() == "argument");
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].back().get_str() == "multiple");
    BOOST_CHECK(testArgs.GetArgs("-ccc").size() == 2);
}